

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomes.c
# Opt level: O3

int isOverworld(int mc,int id)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = biomeExists(mc,id);
  bVar2 = false;
  if (((id - 0xaaU < 4) || (bVar2 = false, (id & 0xfffffffcU) == 0x28)) || (iVar1 == 0))
  goto LAB_00124297;
  bVar2 = false;
  if (id < 0x2f) {
    if (id - 8U < 2) goto LAB_00124297;
    if (id == 10) {
      bVar2 = mc - 0x10U < 0xfffffffa;
      goto LAB_00124297;
    }
    if (id == 0x14) {
      bVar2 = mc < 10;
      goto LAB_00124297;
    }
  }
  else if (id < 0xae) {
    if ((id == 0x2f) || (id == 0x7f)) goto LAB_00124297;
    if (id == 0x9b) {
      bVar2 = mc - 0xeU < 0xfffffffe;
      goto LAB_00124297;
    }
  }
  else if (id - 0xaeU < 2) {
    bVar2 = 0x15 < mc;
    goto LAB_00124297;
  }
  bVar2 = true;
LAB_00124297:
  return (int)bVar2;
}

Assistant:

int isOverworld(int mc, int id)
{
    if (!biomeExists(mc, id))
        return 0;

    if (id >= small_end_islands && id <= end_barrens) return 0;
    if (id >= soul_sand_valley && id <= basalt_deltas) return 0;

    switch (id)
    {
    case nether_wastes:
    case the_end:
        return 0;
    case frozen_ocean:
        return mc <= MC_1_6 || mc >= MC_1_13;
    case mountain_edge:
        return mc <= MC_1_6;
    case deep_warm_ocean:
    case the_void:
        return 0;
    case tall_birch_forest:
        return mc <= MC_1_8 || mc >= MC_1_11;
    case dripstone_caves:
    case lush_caves:
        return mc >= MC_1_18;
    }
    return 1;
}